

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  pointer pRVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Enum EVar6;
  
  uVar3 = (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar5 = (ulong)size;
  EVar6 = Error;
  if (((ulong)offset <= uVar3 - uVar5 && uVar5 <= uVar3) &&
     (bVar2 = Store::HasValueType(store,ref,
                                  (ValueType)*(Enum *)&(this->type_).super_ExternType.field_0xc),
     bVar2)) {
    if (size == 0) {
      EVar6 = Ok;
    }
    else {
      pRVar1 = (this->elements_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_start;
      EVar6 = Ok;
      lVar4 = 0;
      do {
        *(size_t *)((long)&pRVar1[offset].index + lVar4) = ref.index;
        lVar4 = lVar4 + 8;
      } while (uVar5 << 3 != lVar4);
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  if (IsValidRange(offset, size) &&
      store.HasValueType(ref, type_.element)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}